

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O3

char __thiscall ConnectFourState::get_winner(ConnectFourState *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar11;
  pointer pvVar12;
  pointer pvVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  uint uVar10;
  
  uVar2 = this->last_col;
  lVar7 = (long)(int)uVar2;
  if (lVar7 < 0) {
    return '.';
  }
  uVar3 = this->last_row;
  uVar6 = (ulong)uVar3;
  pvVar13 = (this->board).
            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = *(long *)&pvVar13[(int)uVar3].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data;
  cVar1 = *(char *)(lVar17 + lVar7);
  if (uVar2 == 0) {
    uVar15 = 1;
    iVar9 = 1;
  }
  else {
    uVar15 = uVar2 + 1;
    pcVar14 = (char *)(lVar7 + lVar17);
    uVar8 = 0;
    do {
      pcVar14 = pcVar14 + -1;
      uVar10 = uVar8;
      if (*pcVar14 != cVar1) break;
      uVar8 = uVar8 + 1;
      uVar10 = uVar2;
    } while (uVar2 != uVar8);
    iVar9 = uVar10 + 1;
  }
  iVar4 = this->num_cols;
  iVar18 = 0;
  if ((int)uVar15 < iVar4) {
    iVar18 = ~uVar2 + iVar4;
    lVar21 = 0;
    do {
      if (*(char *)(lVar17 + (ulong)uVar15 + lVar21) != cVar1) {
        iVar18 = (int)lVar21;
        break;
      }
      lVar21 = lVar21 + 1;
    } while (iVar18 != (int)lVar21);
  }
  cVar5 = cVar1;
  if ((uint)(iVar9 + iVar18) < 4) {
    if ((int)uVar3 < 1) {
      iVar9 = 1;
    }
    else {
      pvVar12 = pvVar13 + (uVar6 - 1);
      uVar8 = 0;
      do {
        uVar10 = uVar8;
        if (*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                     lVar7) != cVar1) break;
        uVar8 = uVar8 + 1;
        pvVar12 = pvVar12 + -1;
        uVar10 = uVar3;
      } while (uVar3 != uVar8);
      iVar9 = uVar10 + 1;
    }
    iVar18 = this->num_rows;
    lVar17 = (long)(int)uVar3 + 1;
    iVar16 = (int)lVar17;
    iVar20 = 0;
    if (iVar16 < iVar18) {
      pvVar12 = pvVar13 + lVar17;
      iVar11 = 0;
      do {
        iVar20 = iVar11;
        if (*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data + lVar7) != cVar1) break;
        iVar11 = iVar11 + 1;
        pvVar12 = pvVar12 + 1;
        iVar20 = ~uVar3 + iVar18;
      } while (~uVar3 + iVar18 != iVar11);
    }
    if ((uint)(iVar9 + iVar20) < 4) {
      iVar9 = 1;
      if (uVar2 != 0 && 0 < (int)uVar3) {
        pvVar12 = pvVar13 + (uVar6 - 1);
        iVar9 = 0;
        uVar19 = uVar6;
        lVar17 = lVar7;
        do {
          if ((*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl + -1 + lVar17) != cVar1) ||
             (iVar9 = iVar9 + 1, uVar19 < 2)) break;
          pvVar12 = pvVar12 + -1;
          uVar19 = uVar19 - 1;
          iVar20 = (int)lVar17;
          lVar17 = lVar17 + -1;
        } while (1 < iVar20);
        iVar9 = iVar9 + 1;
      }
      iVar20 = 0;
      if ((int)uVar15 < iVar4 && iVar16 < iVar18) {
        pvVar12 = pvVar13 + iVar16;
        uVar19 = 0;
        while (iVar20 = (int)uVar19,
              *(char *)(uVar19 + *(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>
                                           )._M_impl.super__Vector_impl_data + (ulong)uVar15) ==
              cVar1) {
          lVar17 = (long)iVar16 + 1 + uVar19;
          uVar19 = uVar19 + 1;
          if ((iVar18 <= lVar17) || (pvVar12 = pvVar12 + 1, iVar4 <= (int)(iVar20 + uVar2 + 2)))
          goto LAB_0010c145;
        }
        uVar19 = uVar19 & 0xffffffff;
LAB_0010c145:
        iVar20 = (int)uVar19;
      }
      if ((uint)(iVar9 + iVar20) < 4) {
        iVar9 = 1;
        if (iVar16 < iVar18 && uVar2 != 0) {
          pvVar12 = pvVar13 + iVar16;
          lVar17 = 0;
          do {
            if ((*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>).
                                     _M_impl.super__Vector_impl_data + -1 + lVar7) != cVar1) ||
               (lVar21 = (long)iVar16 + 1 + lVar17, lVar17 = lVar17 + 1, iVar18 <= lVar21)) break;
            pvVar12 = pvVar12 + 1;
            iVar9 = (int)lVar7;
            lVar7 = lVar7 + -1;
          } while (1 < iVar9);
          iVar9 = (int)lVar17 + 1;
        }
        uVar19 = 0;
        if ((int)uVar15 < iVar4 && 0 < (int)uVar3) {
          pvVar13 = pvVar13 + (uVar6 - 1);
          uVar19 = 0;
          do {
            iVar18 = (int)uVar19;
            if (*(char *)(uVar19 + *(long *)&(pvVar13->
                                             super__Vector_base<char,_std::allocator<char>_>).
                                             _M_impl + (ulong)uVar15) != cVar1) {
              uVar19 = uVar19 & 0xffffffff;
              break;
            }
            uVar19 = uVar19 + 1;
            if (uVar6 < 2) break;
            pvVar13 = pvVar13 + -1;
            uVar6 = uVar6 - 1;
          } while ((int)(iVar18 + uVar2 + 2) < iVar4);
        }
        cVar5 = '.';
        if (3 < (uint)(iVar9 + (int)uVar19)) {
          cVar5 = cVar1;
        }
      }
    }
  }
  return cVar5;
}

Assistant:

char get_winner() const
	{
		if (last_col < 0) {
			return player_markers[0];
		}

		// We only need to check around the last piece played.
		auto piece = board[last_row][last_col];

		// X X X X
		int left = 0, right = 0;
		for (int col = last_col - 1; col >= 0 && board[last_row][col] == piece; --col) left++;
		for (int col = last_col + 1; col < num_cols && board[last_row][col] == piece; ++col) right++;
		if (left + 1 + right >= 4) {
			return piece;
		}

		// X
		// X
		// X
		// X
		int up = 0, down = 0;
		for (int row = last_row - 1; row >= 0 && board[row][last_col] == piece; --row) up++;
		for (int row = last_row + 1; row < num_rows && board[row][last_col] == piece; ++row) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		// X
		//  X
		//   X
		//    X
		up = 0;
		down = 0;
		for (int row = last_row - 1, col = last_col - 1; row >= 0 && col >= 0 && board[row][col] == piece; --row, --col) up++;
		for (int row = last_row + 1, col = last_col + 1; row < num_rows && col < num_cols && board[row][col] == piece; ++row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		//    X
		//   X
		//  X
		// X
		up = 0;
		down = 0;
		for (int row = last_row + 1, col = last_col - 1; row < num_rows && col >= 0 && board[row][col] == piece; ++row, --col) up++;
		for (int row = last_row - 1, col = last_col + 1; row >= 0 && col < num_cols && board[row][col] == piece; --row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		return player_markers[0];
	}